

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

double __thiscall ON_OBSOLETE_V5_DimRadial::NumericValue(ON_OBSOLETE_V5_DimRadial *this)

{
  ON_2dPoint *this_00;
  double dVar1;
  ON_2dVector local_18;
  
  dVar1 = 0.0;
  if (3 < (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count)
  {
    this_00 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    local_18 = ON_2dPoint::operator-(this_00,this_00 + 1);
    dVar1 = ON_2dVector::Length(&local_18);
    if ((this->super_ON_OBSOLETE_V5_Annotation).m_type == dtDimDiameter) {
      dVar1 = dVar1 + dVar1;
    }
  }
  return dVar1;
}

Assistant:

double ON_OBSOLETE_V5_DimRadial::NumericValue() const
{
  double d = 0.0;
  if ( m_points.Count() >= dim_pt_count )
  {
    d = (m_points[center_pt_index] - m_points[arrow_pt_index]).Length();
    if( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter == m_type )
      d *= 2.0;
  }
  return d;
}